

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

void Cba_ManFree(Cba_Man_t *p)

{
  int *piVar1;
  void **__ptr;
  void *__ptr_00;
  Vec_Vec_t *p_00;
  Hash_IntMan_t *__ptr_01;
  Vec_Ptr_t *p_01;
  int i_1;
  int i_00;
  int i;
  long lVar2;
  
  for (lVar2 = 1; __ptr = (p->vNtks).pArray, lVar2 < (p->vNtks).nSize; lVar2 = lVar2 + 1) {
    __ptr_00 = __ptr[lVar2];
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x18));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x28));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x38));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x48));
    Vec_StrErase((Vec_Str_t *)((long)__ptr_00 + 0x58));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x68));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x78));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x88));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x98));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0xa8));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0xb8));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 200));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0xd8));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0xe8));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0xf8));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x108));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x118));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x128));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x138));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x148));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x158));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x168));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x178));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 400));
    Vec_IntErase((Vec_Int_t *)((long)__ptr_00 + 0x1a0));
    p_00 = *(Vec_Vec_t **)((long)__ptr_00 + 0x188);
    if (p_00 != (Vec_Vec_t *)0x0) {
      for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
        p_01 = Vec_VecEntry(p_00,i_00);
        if (p_01 != (Vec_Ptr_t *)0x0) {
          Vec_PtrFree(p_01);
        }
      }
      Vec_PtrFree((Vec_Ptr_t *)p_00);
    }
    free(__ptr_00);
  }
  if (__ptr != (void **)0x0) {
    free(__ptr);
    (p->vNtks).pArray = (void **)0x0;
  }
  Abc_NamDeref(p->pStrs);
  Abc_NamDeref(p->pFuns);
  Abc_NamDeref(p->pMods);
  __ptr_01 = p->vHash;
  if (__ptr_01 != (Hash_IntMan_t *)0x0) {
    piVar1 = &__ptr_01->nRefs;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Vec_IntFree(__ptr_01->vObjs);
      Vec_IntFree(__ptr_01->vTable);
      free(__ptr_01);
    }
  }
  Vec_IntErase(&p->vNameMap);
  Vec_IntErase(&p->vUsed);
  Vec_IntErase(&p->vNameMap2);
  Vec_IntErase(&p->vUsed2);
  Vec_StrErase(&p->vOut);
  Vec_StrErase(&p->vOut2);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  free(p->pSpec);
  free(p);
  return;
}

Assistant:

static inline void Cba_ManFree( Cba_Man_t * p )
{
    Cba_Ntk_t * pNtk; int i;
    Cba_ManForEachNtk( p, pNtk, i )
        Cba_NtkFree( pNtk );
    ABC_FREE( p->vNtks.pArray );
    Abc_NamDeref( p->pStrs );
    Abc_NamDeref( p->pFuns );
    Abc_NamDeref( p->pMods );
    Hash_IntManDeref( p->vHash );
    Vec_IntErase( &p->vNameMap );
    Vec_IntErase( &p->vUsed );
    Vec_IntErase( &p->vNameMap2 );
    Vec_IntErase( &p->vUsed2 );
    Vec_StrErase( &p->vOut );
    Vec_StrErase( &p->vOut2 );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p );
}